

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mconfig.cpp
# Opt level: O2

void MConfig::copyValue(void *dst,int type,QVariant *value)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  QPoint QVar6;
  bool *ptr;
  char *this;
  anon_union_24_3_e3d07ef4_for_data *this_00;
  float fVar7;
  QRect QVar8;
  const_iterator i1;
  QPointF QVar9;
  anon_union_24_3_e3d07ef4_for_data local_38;
  char *pcStack_20;
  
  this_00 = &local_38;
  cVar3 = QVariant::isNull();
  if (cVar3 != '\0') {
    return;
  }
  switch(type) {
  case 1:
    bVar4 = qvariant_cast<bool>(value);
    *(bool *)dst = bVar4;
    break;
  case 2:
    uVar5 = qvariant_cast<int>(value);
    goto LAB_001061f3;
  case 3:
    uVar5 = qvariant_cast<unsigned_int>(value);
LAB_001061f3:
    *(uint *)dst = uVar5;
    break;
  case 4:
  case 5:
  case 6:
  case 7:
  case 8:
  case 9:
  case 0xb:
  case 0xd:
  case 0xe:
  case 0xf:
  case 0x12:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
switchD_00106129_caseD_4:
    local_38._0_4_ = 2;
    local_38._20_4_ = 0;
    local_38._4_4_ = 0;
    local_38._8_4_ = 0;
    local_38._12_4_ = 0;
    local_38._16_4_ = 0;
    pcStack_20 = "default";
    this = "Config: type unsupported!";
    QMessageLogger::fatal((char *)local_38.data);
    i1 = QHash<QByteArray,_MConfig::ValuePtr>::begin((QHash<QByteArray,_MConfig::ValuePtr> *)this);
    QList<QByteArray>::QList<QHash<QByteArray,_MConfig::ValuePtr>::key_iterator,_true>
              ((QList<QByteArray> *)this_00,(key_iterator)i1.i,(key_iterator)ZEXT816(0));
    return;
  case 10:
    qvariant_cast<QString>((QString *)&local_38,value);
    uVar1 = *dst;
    uVar2 = *(undefined8 *)((long)dst + 8);
    *(ulong *)dst = CONCAT44(local_38._4_4_,local_38._0_4_);
    *(ulong *)((long)dst + 8) = CONCAT44(local_38._12_4_,local_38._8_4_);
    local_38._0_4_ = (undefined4)uVar1;
    local_38._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    local_38._8_4_ = (undefined4)uVar2;
    local_38._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    uVar1 = *(undefined8 *)((long)dst + 0x10);
    *(ulong *)((long)dst + 0x10) = CONCAT44(local_38._20_4_,local_38._16_4_);
    local_38._16_4_ = (undefined4)uVar1;
    local_38._20_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
    break;
  case 0xc:
    qvariant_cast<QByteArray>((QByteArray *)&local_38,value);
    uVar1 = *dst;
    uVar2 = *(undefined8 *)((long)dst + 8);
    *(ulong *)dst = CONCAT44(local_38._4_4_,local_38._0_4_);
    *(ulong *)((long)dst + 8) = CONCAT44(local_38._12_4_,local_38._8_4_);
    local_38._0_4_ = (undefined4)uVar1;
    local_38._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    local_38._8_4_ = (undefined4)uVar2;
    local_38._12_4_ = (undefined4)((ulong)uVar2 >> 0x20);
    uVar1 = *(undefined8 *)((long)dst + 0x10);
    *(ulong *)((long)dst + 0x10) = CONCAT44(local_38._20_4_,local_38._16_4_);
    local_38._16_4_ = (undefined4)uVar1;
    local_38._20_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_38);
    break;
  case 0x10:
    qvariant_cast<QDateTime>((QVariant *)&local_38);
    uVar1 = *dst;
    *(ulong *)dst = CONCAT44(local_38._4_4_,local_38._0_4_);
    local_38._0_4_ = (undefined4)uVar1;
    local_38._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    QDateTime::~QDateTime((QDateTime *)local_38.data);
    break;
  case 0x11:
    qvariant_cast<QUrl>((QVariant *)&local_38);
    uVar1 = *dst;
    *(ulong *)dst = CONCAT44(local_38._4_4_,local_38._0_4_);
    local_38._0_4_ = (undefined4)uVar1;
    local_38._4_4_ = (undefined4)((ulong)uVar1 >> 0x20);
    QUrl::~QUrl((QUrl *)&local_38.shared);
    break;
  case 0x13:
    QVar8 = qvariant_cast<QRect>(value);
    *(QRect *)dst = QVar8;
    break;
  case 0x14:
    qvariant_cast<QRectF>((QRectF *)&local_38,value);
    *(ulong *)((long)dst + 0x10) = CONCAT44(local_38._20_4_,local_38._16_4_);
    *(char **)((long)dst + 0x18) = pcStack_20;
    *(ulong *)dst = CONCAT44(local_38._4_4_,local_38._0_4_);
    *(ulong *)((long)dst + 8) = CONCAT44(local_38._12_4_,local_38._8_4_);
    break;
  case 0x19:
    QVar6 = qvariant_cast<QPoint>(value);
    *(QPoint *)dst = QVar6;
    break;
  case 0x1a:
    QVar9 = qvariant_cast<QPointF>(value);
    *(qreal *)dst = QVar9.xp;
    *(qreal *)((long)dst + 8) = QVar9.yp;
    break;
  default:
    if (type != 0x26) goto switchD_00106129_caseD_4;
    fVar7 = qvariant_cast<float>(value);
    *(float *)dst = fVar7;
  }
  return;
}

Assistant:

void MConfig::copyValue(void *dst, int type, const QVariant &value)
{
    if (value.isNull()) {
        return;
    }

    // In Qt6 arguments of QVariant::canConvert has changed (QVariant::Type is deprecated)
    #if QT_VERSION >= 0x060000
        #define TYPE QMetaType
    #else
        #define TYPE int
    #endif
    Q_ASSERT(value.canConvert(TYPE(type)));
    #undef TYPE

    switch (type) {
        case QMetaType::Int:
            COPY_TYPE(int)
        case QMetaType::UInt:
            COPY_TYPE(uint)
        case QMetaType::QByteArray:
            COPY_TYPE(QByteArray)
        case QMetaType::QString:
            COPY_TYPE(QString)
        case QMetaType::Bool:
            COPY_TYPE(bool)
        case QMetaType::Float:
            COPY_TYPE(float)
        case QMetaType::QPoint:
            COPY_TYPE(QPoint)
        case QMetaType::QPointF:
            COPY_TYPE(QPointF)
        case QMetaType::QRect:
            COPY_TYPE(QRect)
        case QMetaType::QRectF:
            COPY_TYPE(QRectF)
        case QMetaType::QDateTime:
            COPY_TYPE(QDateTime)
        case QMetaType::QUrl:
            COPY_TYPE(QUrl)
        default:
            qFatal("Config: type unsupported!");
    }
}